

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QTextStream * __thiscall
CPP::WriteInitialization::autoTrOutput(WriteInitialization *this,DomProperty *property)

{
  long lVar1;
  bool bVar2;
  WriteInitialization *this_00;
  DomStringList *pDVar3;
  DomProperty *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  DomStringList *list;
  DomString *str;
  DomStringList *in_stack_ffffffffffffff98;
  DomString *in_stack_ffffffffffffffa0;
  QTextStream *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (WriteInitialization *)DomProperty::elementString(in_RSI);
  if (this_00 == (WriteInitialization *)0x0) {
    pDVar3 = DomProperty::elementStringList(in_RSI);
    if ((pDVar3 == (DomStringList *)0x0) ||
       (bVar2 = needsTranslation<DomStringList>(in_stack_ffffffffffffff98), !bVar2)) {
      local_28 = *(QTextStream **)(in_RDI + 0x18);
    }
    else {
      local_28 = (QTextStream *)(in_RDI + 0x1d8);
    }
  }
  else {
    QString::QString((QString *)0x147945);
    local_28 = autoTrOutput(this_00,in_stack_ffffffffffffffa0,
                            &in_stack_ffffffffffffff98->m_attr_notr);
    QString::~QString((QString *)0x147968);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QTextStream &WriteInitialization::autoTrOutput(const DomProperty *property)
{
    if (const DomString *str = property->elementString())
        return autoTrOutput(str);
    if (const DomStringList *list = property->elementStringList())
        if (needsTranslation(list))
            return m_refreshOut;
    return m_output;
}